

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_set_int64_Test::TestBody(Btree_set_int64_Test *this)

{
  long lVar1;
  undefined1 auVar2 [8];
  undefined8 node;
  _Base_ptr p;
  ulong uVar3;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
  _Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
  _Var7;
  vector<long,_std::allocator<long>_> *extraout_RDX;
  vector<long,_std::allocator<long>_> *extraout_RDX_00;
  vector<long,_std::allocator<long>_> *values;
  undefined8 extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_00;
  vector<long,_std::allocator<long>_> *values_01;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  n;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_06;
  size_type n_00;
  int i;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
  *__tmp;
  pointer plVar9;
  char *pcVar10;
  int i_2;
  AssertHelperData *pAVar11;
  bool bVar12;
  AssertionResult AVar13;
  int64_t original_bytes1_2;
  vector<long,_std::allocator<long>_> random_values;
  vector<long,_std::allocator<long>_> sorted_values;
  unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
  container;
  int64_t bytes2;
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  allocator1;
  AssertHelper local_100;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  _Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>
  local_e0;
  _Base_ptr p_Stack_d8;
  AssertHelperData *local_d0;
  undefined1 local_c8 [8];
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
  local_c0;
  _Base_ptr local_b8;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
  local_b0;
  _Rb_tree_node_base local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_88;
  _Rb_tree_node_base local_58;
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  local_38;
  
  (anonymous_namespace)::ConstTest<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>>();
  GenerateValuesWithSeed<long>
            ((vector<long,_std::allocator<long>_> *)local_e8,10000,40000,
             testing::FLAGS_gtest_random_seed);
  local_a8._M_right = &local_a8;
  local_a8._0_8_ =
       &btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
        EmptyNode()::empty_node;
  local_a8._M_parent =
       (_Base_ptr)
       &btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
        EmptyNode()::empty_node;
  local_a8._M_left = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_c8,
             (vector<long,_std::allocator<long>_> *)local_e8);
  _Var7._M_head_impl = local_c0._M_head_impl;
  auVar2 = local_c8;
  values = extraout_RDX;
  if (local_c8 != (undefined1  [8])local_c0._M_head_impl) {
    uVar3 = (long)local_c0._M_head_impl - (long)local_c8 >> 3;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_c8,local_c0._M_head_impl,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar2,_Var7._M_head_impl);
    values = extraout_RDX_00;
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a8,
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_c8,values);
  values_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),
                       local_c8 != (undefined1  [8])local_c0._M_head_impl);
  _Var7._M_head_impl = local_c0._M_head_impl + -8;
  if ((ulong)local_c8 < _Var7._M_head_impl && local_c8 != (undefined1  [8])local_c0._M_head_impl) {
    _Var4._M_head_impl =
         (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          *)((long)local_c8 + 8);
    do {
      plVar9 = ((_Vector_impl_data *)(_Var4._M_head_impl + -8))->_M_start;
      ((_Vector_impl_data *)(_Var4._M_head_impl + -8))->_M_start = *(pointer *)_Var7._M_head_impl;
      *(pointer *)_Var7._M_head_impl = plVar9;
      _Var7._M_head_impl = _Var7._M_head_impl + -8;
      values_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_Var4._M_head_impl + 8);
      bVar12 = _Var4._M_head_impl < _Var7._M_head_impl;
      _Var4._M_head_impl =
           (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            *)values_00;
    } while (bVar12);
  }
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a8,
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_c8,(vector<long,_std::allocator<long>_> *)values_00);
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ((char *)&local_a8,
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_e8,values_01);
  if ((_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
       )local_c8 !=
      (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
       )0x0) {
    operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_88);
  btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::~btree
            ((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
              *)&local_a8);
  if (local_e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e8,(long)p_Stack_d8 - (long)local_e8);
  }
  local_58._0_8_ = 0;
  local_b0._M_head_impl =
       (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
        *)&DAT_00000020;
  local_58._M_right = &local_58;
  local_38.bytes_used_ = (int64_t *)&local_b0;
  p_Var5 = (_Base_ptr)operator_new(0x20);
  local_58._0_8_ = local_58._0_8_ + 0x20;
  p_Var6 = (_Base_ptr)operator_new(0x20);
  local_a8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_right = (_Base_ptr)0x0;
  local_c8 = (undefined1  [8])local_b0._M_head_impl;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8._M_parent = (_Base_ptr)&local_b0;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)local_e8,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)&local_a8,(value_type *)&local_f8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_b0,(long *)local_c8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  if (local_a8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a8,(node_type *)local_a8._0_8_);
  }
  local_a8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_right = (_Base_ptr)0x0;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_100.data_ = (AssertHelperData *)((ulong)local_100.data_._4_4_ << 0x20);
  local_a8._M_parent = &local_58;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"b1.size()","0",(unsigned_long *)&local_f8,(int *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_100.data_ = local_100.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"b2.size()","0",(unsigned_long *)&local_f8,(int *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_b0,(long *)local_c8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  local_58._M_parent = p_Var6;
  local_58._M_left = p_Var5;
  if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  do {
    local_f8._M_head_impl = pbVar8;
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)local_e8,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)&local_a8,(value_type *)&local_f8);
    pbVar8 = pbVar8 + 1;
  } while (pbVar8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0x3e8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes2","bytes1",(long *)&local_58,(long *)&local_b0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  if (local_a8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a8,(node_type *)local_a8._0_8_);
  }
  local_a8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_right = (_Base_ptr)0x0;
  local_c8 = (undefined1  [8])local_b0._M_head_impl;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8._M_parent = (_Base_ptr)&local_b0;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)local_e8,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)&local_a8,(value_type *)&local_f8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_b0,(long *)local_c8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  if (local_a8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a8,(node_type *)local_a8._0_8_);
  }
  local_a8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_right = (_Base_ptr)0x0;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_100.data_ = local_100.data_ & 0xffffffff00000000;
  local_a8._M_parent = &local_58;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"b1.size()","0",(unsigned_long *)&local_f8,(int *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"bytes1","original_bytes1",(long *)&local_b0,(long *)local_c8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  do {
    local_f8._M_head_impl = pbVar8;
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)local_e8,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)&local_a8,(value_type *)&local_f8);
    pbVar8 = pbVar8 + 1;
  } while (pbVar8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     0x3e8);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e8,"bytes2","bytes1",(long *)&local_58,(long *)&local_b0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ ==
        (CountingAllocator<long>)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if ((CountingAllocator<long>)local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ !=
      (CountingAllocator<long>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_);
  }
  if (local_a8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a8,(node_type *)local_a8._0_8_);
  }
  local_a8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_right = (_Base_ptr)0x0;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_b0._M_head_impl;
  local_100.data_ = (AssertHelperData *)0x0;
  local_a8._M_parent = (_Base_ptr)&local_b0;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
            *)local_c8,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
            *)&local_a8,(value_type *)&local_100);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_c8,"bytes1","original_bytes1",(long *)&local_b0,(long *)&local_f8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      plVar9 = (pointer)0x3f69bf;
    }
    else {
      plVar9 = (((_Vector_base<long,_std::allocator<long>_> *)&(local_c0._M_head_impl)->field_0x0)->
               _M_impl).super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,(char *)plVar9);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_100.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_100.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c0._M_head_impl);
  }
  p_Var5 = local_a8._M_right;
  node = local_a8._0_8_;
  local_e0._M_head_impl.super_CountingAllocator<long>.bytes_used_ =
       (PropagatingCountingAlloc<long>)(PropagatingCountingAlloc<long>)local_a8._M_parent;
  p_Stack_d8 = local_a8._M_left;
  local_a8._0_8_ =
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_e8 = (undefined1  [8])node;
  local_a8._M_left =
       (_Base_ptr)
       btree<phmap::priv::set_params<long,std::less<long>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,256,false>>
       ::EmptyNode()::empty_node;
  local_a8._M_right = (_Base_ptr)0x0;
  local_d0 = (AssertHelperData *)p_Var5;
  local_100.data_ = (AssertHelperData *)0x0;
  local_f0.data_._0_4_ = 0;
  local_a8._M_parent = &local_58;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"b1.size()","0",(unsigned_long *)&local_100,(int *)&local_f0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)&(local_c0._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_100.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_100.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c0._M_head_impl);
  }
  local_100.data_ = (AssertHelperData *)p_Var5;
  local_f0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"b2.size()","1",(unsigned_long *)&local_100,(int *)&local_f0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)&(local_c0._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_100.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_100.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c0._M_head_impl);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_c8,"bytes1","original_bytes1",(long *)&local_b0,(long *)&local_f8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)&(local_c0._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_100.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_100.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c0._M_head_impl);
  }
  pAVar11 = (AssertHelperData *)0x1;
  do {
    local_100.data_ = pAVar11;
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>,_long_&,_long_*>,_bool>
              *)local_c8,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>_>
              *)&local_a8,(value_type *)&local_100);
    pAVar11 = (AssertHelperData *)((long)&pAVar11->type + 1);
  } while (pAVar11 != (AssertHelperData *)0x3e8);
  AVar13 = testing::internal::CmpHelperGT<long,long>
                     ((internal *)local_c8,"bytes2","bytes1",(long *)&local_58,(long *)&local_b0);
  p = local_58._M_left;
  p_Var6 = local_58._M_parent;
  n._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar13.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)&(local_c0._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    n = extraout_RDX_02.
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
    if (local_100.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_100.data_ + 8))();
      n._M_head_impl = extraout_RDX_03;
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c0._M_head_impl);
    n._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_04.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((AssertHelperData *)p_Var5 != (AssertHelperData *)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)local_e8,(node_type *)node);
    n._M_head_impl = extraout_RDX_05;
  }
  if (local_a8._M_right != (_Base_ptr)0x0) {
    btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_false>_>
                      *)&local_a8,(node_type *)local_a8._0_8_);
    n._M_head_impl = extraout_RDX_06._M_head_impl;
  }
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::deallocate(&local_38,(pointer)p,(size_type)n._M_head_impl);
  CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
  ::deallocate((CountingAllocator<phmap::btree_set<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>_>_>
                *)&local_58._M_right,(pointer)p_Var6,n_00);
  return;
}

Assistant:

void BtreeTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        unique_checker<T, C> container;

        // Test key insertion/deletion in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test key insertion/deletion in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test key insertion/deletion in random order.
        DoTest("random:    ", &container, random_values);
    }